

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableSize(Thread *this,Instr instr)

{
  Store *store;
  u32 value;
  RefVec *this_00;
  const_reference pvVar1;
  Table *this_01;
  undefined1 local_28 [8];
  Ptr table;
  Thread *this_local;
  
  store = this->store_;
  table.root_index_ = (Index)this;
  this_00 = Instance::tables(this->inst_);
  pvVar1 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)local_28,store,(Ref)pvVar1->index);
  this_01 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_28);
  value = Table::size(this_01);
  Push<unsigned_int>(this,value);
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoTableSize(Instr instr) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  Push<u32>(table->size());
  return RunResult::Ok;
}